

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall mjs::if_statement::~if_statement(if_statement *this)

{
  if_statement *this_local;
  
  ~if_statement(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

explicit if_statement(const source_extend& extend, expression_ptr&& cond, statement_ptr&& if_s, statement_ptr&& else_s) : statement(extend), cond_(std::move(cond)), if_s_(std::move(if_s)), else_s_(std::move(else_s)) {
        assert(cond_);
        assert(if_s_);
    }